

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

MQTTErrors mqtt_disconnect(mqtt_client *client)

{
  mqtt_pal_mutex_t *__mutex;
  uint8_t *puVar1;
  mqtt_queued_message *pmVar2;
  size_t sVar3;
  mqtt_queued_message *pmVar4;
  size_t sVar5;
  MQTTErrors MVar6;
  mqtt_fixed_header local_2c;
  
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return client->error;
  }
  local_2c.control_type = MQTT_CONTROL_DISCONNECT;
  local_2c._4_1_ = local_2c._4_1_ & 0xf0;
  local_2c.remaining_length = 0;
  sVar3 = mqtt_pack_fixed_header((client->mq).curr,(client->mq).curr_sz,&local_2c);
  if ((long)sVar3 < 0) {
LAB_0010363f:
    MVar6 = (MQTTErrors)sVar3;
    client->error = MVar6;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if (sVar3 == 0) {
      mqtt_mq_clean(&client->mq);
      local_2c.control_type = MQTT_CONTROL_DISCONNECT;
      local_2c._4_1_ = local_2c._4_1_ & 0xf0;
      local_2c.remaining_length = 0;
      sVar3 = mqtt_pack_fixed_header((client->mq).curr,(client->mq).curr_sz,&local_2c);
      if ((long)sVar3 < 0) goto LAB_0010363f;
      if (sVar3 == 0) {
        client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return MQTT_ERROR_SEND_BUFFER_IS_FULL;
      }
    }
    puVar1 = (client->mq).curr;
    pmVar2 = (client->mq).queue_tail;
    (client->mq).queue_tail = pmVar2 + -1;
    pmVar2[-1].start = puVar1;
    pmVar2[-1].size = sVar3;
    pmVar4 = (mqtt_queued_message *)(puVar1 + sVar3);
    sVar5 = (long)(pmVar2 + -2) - (long)pmVar4;
    sVar3 = 0;
    if (pmVar4 <= pmVar2 + -2 && sVar5 != 0) {
      sVar3 = sVar5;
    }
    pmVar2[-1].state = MQTT_QUEUED_UNSENT;
    (client->mq).curr = (uint8_t *)pmVar4;
    (client->mq).curr_sz = sVar3;
    pmVar2[-1].control_type = MQTT_CONTROL_DISCONNECT;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    MVar6 = MQTT_OK;
  }
  return MVar6;
}

Assistant:

enum MQTTErrors mqtt_disconnect(struct mqtt_client *client) 
{
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_disconnect(
            client->mq.curr, client->mq.curr_sz
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_DISCONNECT;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}